

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

int tostringbuff(TValue *obj,char *buff)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  lconv *plVar4;
  
  if (obj->tt_ == '\x03') {
    iVar1 = snprintf(buff,0x2c,"%lld",(obj->value_).gc);
    return iVar1;
  }
  iVar2 = snprintf(buff,0x2c,"%.14g",(obj->value_).gc);
  sVar3 = strspn(buff,"-0123456789");
  iVar1 = iVar2;
  if (buff[sVar3] == '\0') {
    plVar4 = localeconv();
    buff[iVar2] = *plVar4->decimal_point;
    iVar1 = iVar2 + 2;
    buff[(long)iVar2 + 1] = '0';
  }
  return iVar1;
}

Assistant:

static int tostringbuff (TValue *obj, char *buff) {
  int len;
  lua_assert(ttisnumber(obj));
  if (ttisinteger(obj))
    len = lua_integer2str(buff, MAXNUMBER2STR, ivalue(obj));
  else {
    len = lua_number2str(buff, MAXNUMBER2STR, fltvalue(obj));
    if (buff[strspn(buff, "-0123456789")] == '\0') {  /* looks like an int? */
      buff[len++] = lua_getlocaledecpoint();
      buff[len++] = '0';  /* adds '.0' to result */
    }
  }
  return len;
}